

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::OrphanBuilder::euthanize(OrphanBuilder *this)

{
  Exception *pEVar1;
  ExceptionCallback *pEVar2;
  anon_class_8_1_8991fb9c *in_RDX;
  Exception *e;
  Exception *_e3887;
  undefined1 local_1a8 [8];
  Maybe<kj::Exception> exception;
  OrphanBuilder *this_local;
  
  _e3887 = (Exception *)this;
  exception.ptr.field_1.value.details.builder.disposer = (ArrayDisposer *)this;
  kj::runCatchingExceptions<capnp::_::OrphanBuilder::euthanize()::__0>
            ((Maybe<kj::Exception> *)local_1a8,(kj *)&_e3887,in_RDX);
  pEVar1 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1a8);
  if (pEVar1 != (Exception *)0x0) {
    pEVar2 = kj::getExceptionCallback();
    pEVar1 = kj::mv<kj::Exception>(pEVar1);
    (*pEVar2->_vptr_ExceptionCallback[2])(pEVar2,pEVar1);
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_1a8);
  return;
}

Assistant:

void OrphanBuilder::euthanize() {
  // Carefully catch any exceptions and rethrow them as recoverable exceptions since we may be in
  // a destructor.
  auto exception = kj::runCatchingExceptions([&]() {
    if (tagAsPtr()->isPositional()) {
      WireHelpers::zeroObject(segment, capTable, tagAsPtr(), location);
    } else {
      WireHelpers::zeroObject(segment, capTable, tagAsPtr());
    }

    WireHelpers::zeroMemory(&tag, ONE * WORDS);
    segment = nullptr;
    location = nullptr;
  });

  KJ_IF_SOME(e, exception) {
    kj::getExceptionCallback().onRecoverableException(kj::mv(e));
  }
}